

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

size_t cmsysEncoding_mbstowcs(wchar_t *dest,char *str,size_t n)

{
  size_t n_local;
  char *str_local;
  wchar_t *dest_local;
  
  if (str == (char *)0x0) {
    dest_local = (wchar_t *)0xffffffffffffffff;
  }
  else {
    dest_local = (wchar_t *)mbstowcs(dest,str,n);
  }
  return (size_t)dest_local;
}

Assistant:

size_t kwsysEncoding_mbstowcs(wchar_t* dest, const char* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return MultiByteToWideChar(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n) -
    1;
#else
  return mbstowcs(dest, str, n);
#endif
}